

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::Consume(ParserImpl *this,string *value)

{
  size_t __n;
  bool bVar1;
  int iVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  __n = (this->tokenizer_).current_.text._M_string_length;
  if (__n == value->_M_string_length) {
    if (__n != 0) {
      iVar2 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,(value->_M_dataplus)._M_p,__n);
      if (iVar2 != 0) goto LAB_00334b71;
    }
    io::Tokenizer::Next(&this->tokenizer_);
    bVar1 = true;
  }
  else {
LAB_00334b71:
    std::operator+(&local_40,"Expected \"",value);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_40);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_90 = *plVar4;
      lStack_88 = plVar3[3];
      local_a0 = &local_90;
    }
    else {
      local_90 = *plVar4;
      local_a0 = (long *)*plVar3;
    }
    local_98 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_a0,
                                (ulong)(this->tokenizer_).current_.text._M_dataplus._M_p);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_70 = *plVar4;
      lStack_68 = plVar3[3];
      local_80 = &local_70;
    }
    else {
      local_70 = *plVar4;
      local_80 = (long *)*plVar3;
    }
    local_78 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_80);
    psVar5 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_60.field_2._M_allocated_capacity = *psVar5;
      local_60.field_2._8_8_ = plVar3[3];
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    }
    else {
      local_60.field_2._M_allocated_capacity = *psVar5;
      local_60._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_60._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if (local_80 != &local_70) {
      operator_delete(local_80,local_70 + 1);
    }
    if (local_a0 != &local_90) {
      operator_delete(local_a0,local_90 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Consume(const string& value) {
    const string& current_value = tokenizer_.current().text;

    if (current_value != value) {
      ReportError("Expected \"" + value + "\", found \"" + current_value
                  + "\".");
      return false;
    }

    tokenizer_.Next();

    return true;
  }